

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

size_t __thiscall cppurses::Text_display::index_at(Text_display *this,Point position)

{
  Text_display *pTVar1;
  size_t sVar2;
  size_type sVar3;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> *pvVar4;
  const_reference pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  value_type info;
  size_t line;
  Text_display *this_local;
  Point position_local;
  
  sVar8 = position.y;
  this_local = (Text_display *)position.x;
  sVar2 = top_line(this);
  sVar3 = std::
          vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
          ::size(&this->display_state_);
  if (sVar3 <= sVar2 + sVar8) {
    pvVar4 = &contents(this)->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>;
    sVar3 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size(pvVar4);
    return sVar3;
  }
  pvVar5 = std::
           vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ::at(&this->display_state_,sVar2 + sVar8);
  sVar2 = pvVar5->start_index;
  pTVar1 = (Text_display *)pvVar5->length;
  if (pTVar1 <= this_local) {
    if (pTVar1 == (Text_display *)0x0) {
      this_local = (Text_display *)0x0;
    }
    else {
      sVar6 = top_line(this);
      sVar7 = last_line(this);
      if (sVar6 + sVar8 != sVar7) {
        sVar2 = top_line(this);
        sVar2 = first_index_at(this,sVar2 + sVar8 + 1);
        return sVar2 - 1;
      }
      sVar6 = top_line(this);
      sVar7 = last_line(this);
      if (sVar6 + sVar8 == sVar7) {
        pvVar4 = &contents(this)->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>;
        sVar3 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size(pvVar4);
        return sVar3;
      }
      this_local = (Text_display *)((long)&pTVar1[-1].alignment_ + 3);
    }
  }
  return (long)(&(this_local->super_Widget).border.segments.north.super_Glyph.brush +
               0xffffffffffffffff) + sVar2;
}

Assistant:

std::size_t Text_display::index_at(Point position) const {
    auto line = this->top_line() + position.y;
    if (line >= display_state_.size()) {
        return this->contents().size();
    }
    auto info = display_state_.at(line);
    if (position.x >= info.length) {
        if (info.length == 0) {
            position.x = 0;
        } else if (this->top_line() + position.y != this->last_line()) {
            return this->first_index_at(this->top_line() + position.y + 1) - 1;
        } else if (this->top_line() + position.y == this->last_line()) {
            return this->contents().size();
        } else {
            position.x = info.length - 1;
        }
    }
    return info.start_index + position.x;
}